

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

char find_placeholder_char(Am_Object *cmd,Am_Slot_Key slot)

{
  bool bVar1;
  uint uVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  void *pvVar5;
  char ret;
  Am_Slot_Key found_slot;
  Am_Object ph;
  Am_Value v;
  undefined1 local_30 [8];
  Am_Value_List placeholders;
  Am_Slot_Key slot_local;
  Am_Object *cmd_local;
  
  placeholders.item._6_2_ = slot;
  pAVar3 = Am_Object::Get(cmd,Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,3);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30,pAVar3);
  bVar1 = Am_Value_List::Valid((Am_Value_List *)local_30);
  if (bVar1) {
    Am_Value::Am_Value((Am_Value *)&ph);
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffa8);
    if ((am_sdebug & 1U) != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"searching placeholders ");
      poVar4 = operator<<(poVar4,(Am_Value_List *)local_30);
      poVar4 = std::operator<<(poVar4," for slot ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,placeholders.item._6_2_);
      pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
    }
    Am_Value_List::Start((Am_Value_List *)local_30);
    while (bVar1 = Am_Value_List::Last((Am_Value_List *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar3 = Am_Value_List::Get((Am_Value_List *)local_30);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffa8,pAVar3);
      pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,0x19c,0);
      uVar2 = Am_Value::operator_cast_to_int(pAVar3);
      if ((uVar2 & 0xffff) == (uint)placeholders.item._6_2_) {
        pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffa8,0x153,0);
        cmd_local._7_1_ = Am_Value::operator_cast_to_char(pAVar3);
        bVar1 = true;
        goto LAB_002d648d;
      }
      Am_Value_List::Next((Am_Value_List *)local_30);
    }
    bVar1 = false;
LAB_002d648d:
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffa8);
    Am_Value::~Am_Value((Am_Value *)&ph);
    if (bVar1) goto LAB_002d64c0;
  }
  cmd_local._7_1_ = '\0';
LAB_002d64c0:
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  return cmd_local._7_1_;
}

Assistant:

char
find_placeholder_char(Am_Object &cmd, Am_Slot_Key slot)
{
  Am_Value_List placeholders =
      cmd.Get(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (placeholders.Valid()) {
    Am_Value v;
    Am_Object ph;
    if (am_sdebug)
      std::cout << "searching placeholders " << placeholders << " for slot "
                << slot << std::endl
                << std::flush;
    Am_Slot_Key found_slot;
    for (placeholders.Start(); !placeholders.Last(); placeholders.Next()) {
      ph = placeholders.Get();
      found_slot = (Am_Slot_Key)(int)ph.Get(Am_SLOT_FOR_VALUE);
      if (found_slot == slot) {
        char ret = ph.Get(Am_ID);
        return ret;
      }
    }
  }
  return 0;
}